

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O2

char16_t * PAL_wcsncpy(char16_t *strDest,char16_t *strSource,size_t count)

{
  size_t sVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    memset(strDest,0,(ulong)(uint)((int)count * 2));
    sVar1 = PAL_wcslen(strSource);
    if (sVar1 < count) {
      count = sVar1;
    }
    memcpy(strDest,strSource,(ulong)(uint)((int)count * 2));
    if (PAL_InitializeChakraCoreCalled != false) {
      return strDest;
    }
  }
  abort();
}

Assistant:

char16_t *
__cdecl
PAL_wcsncpy( char16_t * strDest, const char16_t *strSource, size_t count )
{
    UINT length = sizeof( char16_t ) * count;
    PERF_ENTRY(wcsncpy);
    ENTRY("wcsncpy( strDest:%p, strSource:%p (%S), count:%lu)\n",
          strDest, strSource, strSource, (unsigned long) count);

    memset( strDest, 0, length );
    length = min( count, PAL_wcslen( strSource ) ) * sizeof( char16_t );
    memcpy( strDest, strSource, length );

    LOGEXIT("wcsncpy returning (char16_t*): %p\n", strDest);
    PERF_EXIT(wcsncpy);
    return strDest;
}